

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_ghost_int(REF_NODE ref_node,REF_INT *vector,REF_INT ldim)

{
  size_t __size;
  int iVar1;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  uint uVar5;
  REF_INT *send_size;
  long lVar6;
  REF_INT *recv_size;
  long lVar7;
  void *pvVar8;
  undefined4 *puVar9;
  int iVar10;
  undefined8 uVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  REF_INT local;
  int local_9c;
  ulong local_98;
  REF_NODE local_90;
  undefined1 local_88 [16];
  void *local_78;
  void *local_70;
  ulong local_68;
  void *local_60;
  void *local_58;
  REF_INT *local_50;
  ulong local_48;
  ulong local_40;
  undefined4 *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar5 = ref_mpi->n;
  if ((long)(int)uVar5 < 2) {
    return 0;
  }
  __size = (long)(int)uVar5 * 4;
  local_90 = ref_node;
  send_size = (REF_INT *)malloc(__size);
  auVar3 = _DAT_00211c80;
  if (send_size == (REF_INT *)0x0) {
    pcVar13 = "malloc a_size of REF_INT NULL";
    uVar11 = 0x398;
    goto LAB_0017dd15;
  }
  lVar6 = (ulong)uVar5 - 1;
  auVar20._8_4_ = (int)lVar6;
  auVar20._0_8_ = lVar6;
  auVar20._12_4_ = (int)((ulong)lVar6 >> 0x20);
  lVar6 = 0;
  local_88 = auVar20 ^ _DAT_00211c80;
  auVar21 = _DAT_00211c60;
  auVar18 = _DAT_00211c70;
  do {
    auVar20 = auVar18 ^ auVar3;
    iVar10 = local_88._4_4_;
    if ((bool)(~(auVar20._4_4_ == iVar10 && local_88._0_4_ < auVar20._0_4_ || iVar10 < auVar20._4_4_
                ) & 1)) {
      *(undefined4 *)((long)send_size + lVar6) = 0;
    }
    if ((auVar20._12_4_ != local_88._12_4_ || auVar20._8_4_ <= local_88._8_4_) &&
        auVar20._12_4_ <= local_88._12_4_) {
      *(undefined4 *)((long)send_size + lVar6 + 4) = 0;
    }
    auVar20 = auVar21 ^ auVar3;
    iVar22 = auVar20._4_4_;
    if (iVar22 <= iVar10 && (iVar22 != iVar10 || auVar20._0_4_ <= local_88._0_4_)) {
      *(undefined4 *)((long)send_size + lVar6 + 8) = 0;
      *(undefined4 *)((long)send_size + lVar6 + 0xc) = 0;
    }
    lVar7 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 4;
    auVar18._8_8_ = lVar7 + 4;
    lVar7 = auVar21._8_8_;
    auVar21._0_8_ = auVar21._0_8_ + 4;
    auVar21._8_8_ = lVar7 + 4;
    lVar6 = lVar6 + 0x10;
  } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar6);
  local_50 = vector;
  recv_size = (REF_INT *)malloc(__size);
  auVar3 = _DAT_00211c80;
  if (recv_size == (REF_INT *)0x0) {
    pcVar13 = "malloc b_size of REF_INT NULL";
    uVar11 = 0x399;
    goto LAB_0017dd15;
  }
  lVar6 = 0;
  auVar17 = _DAT_00211c60;
  auVar19 = _DAT_00211c70;
  do {
    auVar21 = auVar19 ^ auVar3;
    if ((bool)(~(auVar21._4_4_ == local_88._4_4_ && (int)local_88._0_4_ < auVar21._0_4_ ||
                (int)local_88._4_4_ < auVar21._4_4_) & 1)) {
      *(undefined4 *)((long)recv_size + lVar6) = 0;
    }
    if ((auVar21._12_4_ != local_88._12_4_ || auVar21._8_4_ <= (int)local_88._8_4_) &&
        auVar21._12_4_ <= (int)local_88._12_4_) {
      *(undefined4 *)((long)recv_size + lVar6 + 4) = 0;
    }
    auVar21 = auVar17 ^ auVar3;
    iVar10 = auVar21._4_4_;
    if (iVar10 <= (int)local_88._4_4_ &&
        (iVar10 != local_88._4_4_ || auVar21._0_4_ <= (int)local_88._0_4_)) {
      *(undefined4 *)((long)recv_size + lVar6 + 8) = 0;
      *(undefined4 *)((long)recv_size + lVar6 + 0xc) = 0;
    }
    lVar7 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 4;
    auVar19._8_8_ = lVar7 + 4;
    lVar7 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 4;
    auVar17._8_8_ = lVar7 + 4;
    lVar6 = lVar6 + 0x10;
  } while ((ulong)(uVar5 + 3 >> 2) << 4 != lVar6);
  iVar10 = local_90->max;
  if (0 < (long)iVar10) {
    pRVar2 = local_90->global;
    lVar6 = 0;
    do {
      if ((-1 < pRVar2[lVar6]) && (ref_mpi->id != local_90->part[lVar6])) {
        send_size[local_90->part[lVar6]] = send_size[local_90->part[lVar6]] + 1;
      }
      lVar6 = lVar6 + 1;
    } while (iVar10 != lVar6);
  }
  uVar5 = ref_mpi_alltoall(ref_mpi,send_size,recv_size,1);
  if (uVar5 != 0) {
    pcVar13 = "alltoall sizes";
    uVar11 = 0x3a2;
    goto LAB_0017dcc5;
  }
  uVar5 = ref_mpi->n;
  lVar6 = (long)(int)uVar5;
  if (lVar6 < 1) {
    local_88._0_4_ = ldim;
    uVar14 = 0;
    pvVar8 = malloc(0);
    local_98 = 0;
    uVar12 = 0;
    if (pvVar8 != (void *)0x0) {
LAB_0017de2e:
      local_68 = (ulong)uVar14;
      local_60 = pvVar8;
      pvVar8 = malloc(local_68 * 8);
      if (pvVar8 == (void *)0x0) {
        pcVar13 = "malloc b_global of REF_GLOB NULL";
        uVar11 = 0x3aa;
      }
      else {
        if ((int)uVar5 < 0) {
          pcVar13 = "malloc a_next of REF_INT negative";
          uVar11 = 0x3ac;
          goto LAB_0017df87;
        }
        puVar9 = (undefined4 *)malloc(lVar6 * 4);
        if (puVar9 == (undefined4 *)0x0) {
          pcVar13 = "malloc a_next of REF_INT NULL";
          uVar11 = 0x3ac;
        }
        else {
          *puVar9 = 0;
          if (1 < uVar5) {
            lVar7 = 0;
            iVar10 = 0;
            do {
              iVar10 = iVar10 + send_size[lVar7];
              puVar9[lVar7 + 1] = iVar10;
              lVar7 = lVar7 + 1;
            } while (lVar6 + -1 != lVar7);
          }
          iVar10 = local_90->max;
          uVar4 = local_88._0_4_;
          if (0 < (long)iVar10) {
            pRVar2 = local_90->global;
            lVar6 = 0;
            do {
              if ((-1 < pRVar2[lVar6]) &&
                 (iVar22 = local_90->part[lVar6], local_90->ref_mpi->id != iVar22)) {
                iVar1 = puVar9[iVar22];
                *(REF_GLOB *)((long)local_60 + (long)iVar1 * 8) = pRVar2[lVar6];
                puVar9[iVar22] = iVar1 + 1;
              }
              lVar6 = lVar6 + 1;
            } while (iVar10 != lVar6);
          }
          local_58 = pvVar8;
          local_38 = puVar9;
          uVar5 = ref_mpi_alltoallv(ref_mpi,local_60,send_size,pvVar8,recv_size,1,2);
          uVar15 = local_68;
          if (uVar5 != 0) {
            pcVar13 = "alltoallv global";
            uVar11 = 0x3bc;
LAB_0017dcc5:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   uVar11,"ref_node_ghost_int",(ulong)uVar5,pcVar13);
            return uVar5;
          }
          iVar10 = (int)(0x7fffffff / (long)(int)uVar4);
          iVar22 = (int)local_68;
          if (((int)uVar12 < iVar10) && (iVar22 < iVar10)) {
            if ((int)(uVar12 * uVar4) < 0) {
              pcVar13 = "malloc a_vector of REF_INT negative";
              uVar11 = 0x3bf;
LAB_0017df87:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,uVar11,"ref_node_ghost_int",pcVar13);
              return 1;
            }
            local_78 = malloc((ulong)(uVar12 * uVar4) << 2);
            if (local_78 == (void *)0x0) {
              pcVar13 = "malloc a_vector of REF_INT NULL";
              uVar11 = 0x3bf;
            }
            else {
              if (iVar22 * uVar4 < 0) {
                pcVar13 = "malloc b_vector of REF_INT negative";
                uVar11 = 0x3c0;
                goto LAB_0017df87;
              }
              local_70 = malloc((ulong)(uint)(iVar22 * uVar4) << 2);
              if (local_70 != (void *)0x0) {
                if (uVar15 != 0) {
                  local_40 = (ulong)(uint)local_88._0_4_ << 2;
                  local_98 = 0;
                  local_48 = (ulong)(int)local_88._0_4_;
                  uVar15 = 0;
                  do {
                    uVar5 = ref_node_local(local_90,*(REF_GLOB *)((long)local_58 + uVar15 * 8),
                                           &local_9c);
                    if (uVar5 != 0) {
                      pcVar13 = "g2l";
                      uVar11 = 0x3c2;
                      goto LAB_0017dcc5;
                    }
                    iVar10 = (int)local_98;
                    if (0 < (int)local_88._0_4_) {
                      memcpy((void *)((long)local_70 + (local_98 & 0xffffffff) * 4),
                             local_50 + (long)local_9c * local_48,local_40);
                    }
                    uVar15 = uVar15 + 1;
                    local_98 = (ulong)(uint)(iVar10 + local_88._0_4_);
                  } while (local_68 != uVar15);
                }
                uVar5 = ref_mpi_alltoallv(ref_mpi,local_70,recv_size,local_78,send_size,
                                          local_88._0_4_,1);
                if (uVar5 == 0) {
                  if (uVar12 != 0) {
                    local_98 = (ulong)(uint)local_88._0_4_ << 2;
                    uVar15 = 0;
                    local_68 = (ulong)(int)local_88._0_4_;
                    uVar16 = 0;
                    do {
                      uVar5 = ref_node_local(local_90,*(REF_GLOB *)((long)local_60 + uVar16 * 8),
                                             &local_9c);
                      if (uVar5 != 0) {
                        pcVar13 = "g2l";
                        uVar11 = 0x3cc;
                        goto LAB_0017dcc5;
                      }
                      if (0 < (int)local_88._0_4_) {
                        memcpy(local_50 + (long)local_9c * local_68,
                               (void *)((long)local_78 + uVar15 * 4),local_98);
                      }
                      uVar16 = uVar16 + 1;
                      uVar15 = (ulong)(uint)((int)uVar15 + local_88._0_4_);
                    } while (uVar12 != uVar16);
                  }
                  goto LAB_0017e467;
                }
                pcVar13 = "alltoallv vector";
                uVar11 = 0x3c9;
                goto LAB_0017dcc5;
              }
              pcVar13 = "malloc b_vector of REF_INT NULL";
              uVar11 = 0x3c0;
              local_70 = (void *)0x0;
            }
          }
          else {
            local_78 = malloc(local_98 << 2);
            if (local_78 == (void *)0x0) {
              pcVar13 = "malloc a_vector of REF_INT NULL";
              uVar11 = 0x3d3;
            }
            else {
              local_70 = malloc(uVar15 * 4);
              if (local_70 != (void *)0x0) {
                if (0 < (int)uVar4) {
                  local_88 = CONCAT124(local_88._4_12_,uVar4);
                  local_40 = 1;
                  if (1 < iVar22) {
                    local_40 = uVar15 & 0xffffffff;
                  }
                  local_48 = 1;
                  if (1 < (int)uVar12) {
                    local_48 = (ulong)uVar12;
                  }
                  local_98 = 0;
                  do {
                    if (uVar15 != 0) {
                      uVar15 = 0;
                      do {
                        uVar5 = ref_node_local(local_90,*(REF_GLOB *)((long)local_58 + uVar15 * 8),
                                               &local_9c);
                        if (uVar5 != 0) {
                          pcVar13 = "g2l";
                          uVar11 = 0x3d7;
                          goto LAB_0017dcc5;
                        }
                        *(REF_INT *)((long)local_70 + uVar15 * 4) =
                             local_50[local_9c * local_88._0_4_ + (int)local_98];
                        uVar15 = uVar15 + 1;
                      } while (local_40 != uVar15);
                    }
                    uVar5 = ref_mpi_alltoallv(ref_mpi,local_70,recv_size,local_78,send_size,1,1);
                    if (uVar5 != 0) {
                      pcVar13 = "alltoallv vector";
                      uVar11 = 0x3dd;
                      goto LAB_0017dcc5;
                    }
                    if (uVar12 != 0) {
                      uVar15 = 0;
                      do {
                        uVar5 = ref_node_local(local_90,*(REF_GLOB *)((long)local_60 + uVar15 * 8),
                                               &local_9c);
                        if (uVar5 != 0) {
                          pcVar13 = "g2l";
                          uVar11 = 0x3e0;
                          goto LAB_0017dcc5;
                        }
                        local_50[local_9c * local_88._0_4_ + (int)local_98] =
                             *(REF_INT *)((long)local_78 + uVar15 * 4);
                        uVar15 = uVar15 + 1;
                      } while (local_48 != uVar15);
                    }
                    uVar5 = (int)local_98 + 1;
                    local_98 = (ulong)uVar5;
                    uVar15 = local_68;
                  } while (uVar5 != local_88._0_4_);
                }
LAB_0017e467:
                free(local_70);
                free(local_78);
                free(local_38);
                free(local_58);
                free(local_60);
                free(recv_size);
                free(send_size);
                return 0;
              }
              pcVar13 = "malloc b_vector of REF_INT NULL";
              uVar11 = 0x3d4;
              local_70 = (void *)0x0;
            }
          }
        }
      }
      goto LAB_0017dd15;
    }
  }
  else {
    lVar7 = 0;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + send_size[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
    if ((int)uVar12 < 0) {
      pcVar13 = "malloc a_global of REF_GLOB negative";
      uVar11 = 0x3a6;
      goto LAB_0017df87;
    }
    local_88._0_4_ = ldim;
    local_98 = (ulong)uVar12;
    pvVar8 = malloc(local_98 * 8);
    if (pvVar8 != (void *)0x0) {
      if ((int)uVar5 < 1) {
        uVar14 = 0;
      }
      else {
        lVar7 = 0;
        uVar14 = 0;
        do {
          uVar14 = uVar14 + recv_size[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar6 != lVar7);
        if ((int)uVar14 < 0) {
          pcVar13 = "malloc b_global of REF_GLOB negative";
          uVar11 = 0x3aa;
          goto LAB_0017df87;
        }
      }
      goto LAB_0017de2e;
    }
  }
  pcVar13 = "malloc a_global of REF_GLOB NULL";
  uVar11 = 0x3a6;
LAB_0017dd15:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar11,
         "ref_node_ghost_int",pcVar13);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_ghost_int(REF_NODE ref_node, REF_INT *vector,
                                      REF_INT ldim) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_INT *a_vector, *b_vector;
  REF_INT i, local;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_global, a_total, REF_GLOB);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_global, b_total, REF_GLOB);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  if (a_total < REF_INT_MAX / ldim && b_total < REF_INT_MAX / ldim) {
    ref_malloc(a_vector, ldim * a_total, REF_INT);
    ref_malloc(b_vector, ldim * b_total, REF_INT);
    for (node = 0; node < b_total; node++) {
      RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        b_vector[i + ldim * node] = vector[i + ldim * local];
    }

    RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, ldim,
                          REF_INT_TYPE),
        "alltoallv vector");

    for (node = 0; node < a_total; node++) {
      RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        vector[i + ldim * local] = a_vector[i + ldim * node];
    }
    free(b_vector);
    free(a_vector);
  } else {
    ref_malloc(a_vector, a_total, REF_INT);
    ref_malloc(b_vector, b_total, REF_INT);
    for (i = 0; i < ldim; i++) {
      for (node = 0; node < b_total; node++) {
        RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
        b_vector[node] = vector[i + ldim * local];
      }

      RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, 1,
                            REF_INT_TYPE),
          "alltoallv vector");

      for (node = 0; node < a_total; node++) {
        RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
        vector[i + ldim * local] = a_vector[node];
      }
    }
    free(b_vector);
    free(a_vector);
  }

  free(a_next);
  free(b_global);
  free(a_global);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}